

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_7b5804::HandleFilesMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool programs;
  bool bVar3;
  PolicyStatus PVar4;
  string *psVar5;
  size_type sVar6;
  cmGlobalGenerator *pcVar7;
  ostream *poVar8;
  PolicyID id;
  char *pcVar9;
  pointer filename;
  MessageType t;
  static_string_view name;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_4e8;
  string destination;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  string type;
  Helper helper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmAlphaNum local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  string local_3d0;
  string local_3b0;
  ostringstream e;
  ParseResult local_218;
  cmInstallCommandArguments ica;
  
  Helper::Helper(&helper,status);
  programs = std::operator==((args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,"PROGRAMS");
  std::__cxx11::string::string((string *)&local_3b0,(string *)&helper.DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar9 = "FILES";
  if (programs) {
    pcVar9 = "PROGRAMS";
  }
  name.super_string_view._M_len = (ulong)programs * 3 + 5;
  name.super_string_view._M_str = pcVar9;
  cmArgumentParser<void>::
  Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&ica.super_cmArgumentParser<void>,name,&files);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&ica.super_cmArgumentParser<void>,args,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _e = (cmInstallGenerator *)
         ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_418.View_._M_len = 0x19;
    local_418.View_._M_str = " given unknown argument \"";
    cmStrCat<std::__cxx11::string,char[3]>
              (&type,(cmAlphaNum *)&e,&local_418,
               unknownArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(char (*) [3])0x5cc634);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&type);
    bVar3 = false;
    goto LAB_0024b97e;
  }
  psVar5 = cmInstallCommandArguments::GetType_abi_cxx11_(&ica);
  std::__cxx11::string::string((string *)&type,(string *)psVar5);
  if (type._M_string_length == 0) {
LAB_0024b607:
    if (files.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        files.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = true;
    }
    else {
      psVar5 = cmInstallCommandArguments::GetRename_abi_cxx11_(&ica);
      if ((psVar5->_M_string_length != 0) &&
         (0x20 < (ulong)((long)files.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)files.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        _e = (cmInstallGenerator *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
        local_418.View_._M_len = 0x2d;
        local_418.View_._M_str = " given RENAME option with more than one file.";
        cmStrCat<>(&destination,(cmAlphaNum *)&e,&local_418);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0024b8aa;
      }
      absFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      absFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      absFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar3 = Helper::MakeFilesFullPath
                        (&helper,(((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         &files.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ,&absFiles);
      if (bVar3) {
        PVar4 = cmMakefile::GetPolicyStatus(helper.Makefile,CMP0062,false);
        pcVar7 = cmMakefile::GetGlobalGenerator(helper.Makefile);
        pbVar1 = files.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (filename = files.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; filename != pbVar1;
            filename = filename + 1) {
          bVar3 = cmGlobalGenerator::IsExportedTargetsFile(pcVar7,filename);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            bVar3 = true;
            pcVar9 = "may";
            t = FATAL_ERROR;
            if (PVar4 - NEW < 3) {
LAB_0024b7a2:
              poVar8 = std::operator<<((ostream *)&e,"The file\n  ");
              poVar8 = std::operator<<(poVar8,(string *)filename);
              poVar8 = std::operator<<(poVar8,"\nwas generated by the export() command.  It ");
              poVar8 = std::operator<<(poVar8,pcVar9);
              std::operator<<(poVar8,
                              " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                             );
              pcVar2 = helper.Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar2,t,(string *)&local_418);
              std::__cxx11::string::~string((string *)&local_418);
              if (bVar3) {
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                goto LAB_0024b965;
              }
            }
            else if (PVar4 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_418,(cmPolicies *)0x3e,id);
              poVar8 = std::operator<<((ostream *)&e,(string *)&local_418);
              std::operator<<(poVar8,"\n");
              std::__cxx11::string::~string((string *)&local_418);
              bVar3 = false;
              pcVar9 = "should";
              t = AUTHOR_WARNING;
              goto LAB_0024b7a2;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
        }
        bVar3 = cmInstallCommandArguments::Finalize(&ica);
        if (!bVar3) goto LAB_0024b965;
        if (type._M_string_length != 0) {
          psVar5 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
          if (psVar5->_M_string_length != 0) {
            _e = (cmInstallGenerator *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
            local_418.View_._M_len = (size_t)&DAT_00000045;
            local_418.View_._M_str =
                 " given both TYPE and DESTINATION arguments. You may only specify one.";
            cmStrCat<>(&destination,(cmAlphaNum *)&e,&local_418);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            std::__cxx11::string::~string((string *)&destination);
            goto LAB_0024b965;
          }
        }
        Helper::GetDestinationForType(&destination,&helper,&ica,&type);
        pcVar2 = helper.Makefile;
        bVar3 = destination._M_string_length != 0;
        if (destination._M_string_length == 0) {
          _e = (cmInstallGenerator *)
               ((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          local_418.View_._M_len = 0x16;
          local_418.View_._M_str = " given no DESTINATION!";
          cmStrCat<>(&local_3d0,(cmAlphaNum *)&e,&local_418);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&local_3d0);
        }
        else {
          CreateInstallFilesGenerator
                    ((anon_unknown_dwarf_7b5804 *)&e,helper.Makefile,&absFiles,&ica,programs,
                     &destination);
          local_4e8._M_head_impl = _e;
          _e = (cmInstallGenerator *)0x0;
          cmMakefile::AddInstallGenerator
                    (pcVar2,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                             *)&local_4e8);
          if (local_4e8._M_head_impl != (cmInstallGenerator *)0x0) {
            (*((local_4e8._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
          }
          local_4e8._M_head_impl = (cmInstallGenerator *)0x0;
          if (_e != (cmInstallGenerator *)0x0) {
            (*(_e->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
          }
          pcVar7 = cmMakefile::GetGlobalGenerator(helper.Makefile);
          psVar5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
          cmGlobalGenerator::AddInstallComponent(pcVar7,psVar5);
        }
        std::__cxx11::string::~string((string *)&destination);
      }
      else {
LAB_0024b965:
        bVar3 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&absFiles);
    }
  }
  else {
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(anonymous_namespace)::allowedTypes_abi_cxx11_,&type);
    if (sVar6 != 0) goto LAB_0024b607;
    _e = (cmInstallGenerator *)
         ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_418.View_._M_len = (size_t)&DAT_00000011;
    local_418.View_._M_str = " given non-type \"";
    cmStrCat<std::__cxx11::string,char[22]>
              (&destination,(cmAlphaNum *)&e,&local_418,&type,
               (char (*) [22])"\" with TYPE argument.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0024b8aa:
    std::__cxx11::string::~string((string *)&destination);
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&type);
LAB_0024b97e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  std::__cxx11::string::~string((string *)&helper.DefaultComponentName);
  return bVar3;
}

Assistant:

bool HandleFilesMode(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(helper.DefaultComponentName);
  ArgumentParser::MaybeEmpty<std::vector<std::string>> files;
  ica.Bind(programs ? "PROGRAMS"_s : "FILES"_s, files);
  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    status.SetError(
      cmStrCat(args[0], " given non-type \"", type, "\" with TYPE argument."));
    return false;
  }

  const std::vector<std::string>& filesVector = files;

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    status.SetError(
      cmStrCat(args[0], " given RENAME option with more than one file."));
    return false;
  }

  std::vector<std::string> absFiles;
  if (!helper.MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus policyStatus =
    helper.Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = helper.Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (policyStatus) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
          break;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        helper.Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION arguments. "
                             "You may only specify one."));
    return false;
  }

  std::string destination = helper.GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Create the files install generator.
  helper.Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    helper.Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}